

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HgtFilesGrid.cpp
# Opt level: O2

void __thiscall HgtFilesGrid::Init(HgtFilesGrid *this,int maxLoadedFiles,char *filesPath)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  Heights *pHVar5;
  FILE *__stream;
  ostream *poVar6;
  char *__dest;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  FileFlag (*paFVar10) [361];
  int iVar11;
  long lVar12;
  string fileName;
  char demFileName [12];
  
  this->loadedFiles = 0;
  this->MAX_LOADED_FILES = maxLoadedFiles;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)maxLoadedFiles;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x2c04d0),8) == 0) {
    uVar9 = SUB168(auVar3 * ZEXT816(0x2c04d0),0);
  }
  pHVar5 = (Heights *)operator_new__(uVar9);
  this->dataStack = pHVar5;
  uVar7 = 0;
  uVar9 = (ulong)(uint)maxLoadedFiles;
  if (maxLoadedFiles < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 * 0x2c04d0 - uVar7 != 0; uVar7 = uVar7 + 0x2c04d0) {
    *(undefined8 *)((long)&pHVar5->pFileFlag + uVar7) = 0;
  }
  paFVar10 = this->hgtFilesGrid;
  for (lVar8 = 0; lVar8 != 0xb5; lVar8 = lVar8 + 1) {
    iVar11 = -0xb4;
    for (lVar12 = 0; lVar12 != 0x21d8; lVar12 = lVar12 + 0x18) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileName,filesPath,(allocator<char> *)demFileName);
      HgtFormat::crdtodem((double)(0x5a - (int)lVar8),(double)iVar11,demFileName);
      std::__cxx11::string::append((char *)&fileName);
      __stream = fopen(fileName._M_dataplus._M_p,"rb");
      if (__stream == (FILE *)0x0) {
        *(undefined8 *)((long)&(*paFVar10)[0].fileName + lVar12) = 0;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"loaded: ");
        poVar6 = std::operator<<(poVar6,(string *)&fileName);
        std::operator<<(poVar6,"\n");
        __dest = (char *)operator_new__((long)((int)fileName._M_string_length + 1));
        *(char **)((long)&(*paFVar10)[0].fileName + lVar12) = __dest;
        strcpy(__dest,fileName._M_dataplus._M_p);
        fclose(__stream);
      }
      *(undefined8 *)((long)&(*paFVar10)[0].pHeightData + lVar12) = 0;
      (&(*paFVar10)[0].isLoaded)[lVar12] = false;
      std::__cxx11::string::~string((string *)&fileName);
      iVar11 = iVar11 + 1;
    }
    paFVar10 = paFVar10 + 1;
  }
  for (lVar8 = 0x21d0; lVar8 != 0x180f88; lVar8 = lVar8 + 0x21d8) {
    *(undefined8 *)((long)&this->hgtFilesGrid[0][0].fileName + lVar8) =
         *(undefined8 *)((long)this + lVar8 + -0x21b0);
    puVar2 = (undefined8 *)((long)this + lVar8 + -0x21c0);
    uVar4 = puVar2[1];
    puVar1 = (undefined8 *)((long)(this->hgtFilesGrid + -1) + 0x21c8 + lVar8);
    *puVar1 = *puVar2;
    puVar1[1] = uVar4;
  }
  return;
}

Assistant:

void HgtFilesGrid::Init( int maxLoadedFiles, const char* filesPath )
{
	this->loadedFiles = 0;
	this->MAX_LOADED_FILES = maxLoadedFiles;
	this->dataStack = new Heights[maxLoadedFiles];
	for( int i = 0; i < maxLoadedFiles; i++ )
		this->dataStack[i].pFileFlag = NULL;

	for( int i = 0; i <= 180; i++ ){
		for( int j = 0; j <= 360; j++ ){
			FILE *fp;
			std::string fileName(filesPath);
			char demFileName[12];
			fileName.append(HgtFormat::crdtodem(90 - i, -180 + j, demFileName));
            fp = fopen(fileName.c_str(), "rb");
            
			if( fp == NULL ) {
				
				this->hgtFilesGrid[i][j].fileName = NULL;
			} else {
				std::cout << "loaded: " << fileName << "\n";
				int length = fileName.length();
				this->hgtFilesGrid[i][j].fileName = new char[length + 1];
                strcpy(hgtFilesGrid[i][j].fileName, fileName.c_str());
                
				//strcpy_s( hgtFilesGrid[i][j].fileName, length + 1, fileName.c_str() );
				fclose(fp);
			}
			this->hgtFilesGrid[i][j].pHeightData = NULL;
			this->hgtFilesGrid[i][j].isLoaded = false;
		}
	}

	for( int i = 0; i <= 180; i++ ){
		this->hgtFilesGrid[i][360] = this->hgtFilesGrid[i][0];
	}
}